

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O0

ActionMessage *
helics::apps::TypedBrokerServer::generateMessageResponse
          (ActionMessage *rxcmd,portData *pdata,CoreType ctype)

{
  action_t aVar1;
  int iVar2;
  portData *in_RDX;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  pair<std::shared_ptr<helics::Broker>,_bool> nbrk;
  int pt;
  ActionMessage *rep;
  shared_ptr<helics::Broker> *in_stack_00000080;
  ActionMessage *in_stack_00000088;
  int in_stack_00000170;
  CoreType in_stack_00000174;
  ActionMessage *in_stack_00000178;
  ActionMessage *pAVar3;
  action_t in_stack_ffffffffffffffbc;
  ActionMessage *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  portData *in_stack_ffffffffffffffd0;
  byte local_28;
  
  pAVar3 = in_RDI;
  aVar1 = ActionMessage::action(in_RSI);
  if ((((aVar1 == cmd_protocol_priority) || (aVar1 == cmd_protocol)) || (aVar1 == cmd_protocol_big))
     && ((in_RSI->messageID == 299 || (in_RSI->messageID == 0x5af)))) {
    iVar2 = getOpenPort(in_RDX);
    if (iVar2 < 1) {
      ActionMessage::ActionMessage(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      pAVar3->messageID = 0xed3;
    }
    else {
      findBroker(in_stack_00000178,in_stack_00000174,in_stack_00000170);
      if ((local_28 & 1) != 0) {
        assignPort(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                   (shared_ptr<helics::Broker> *)in_stack_ffffffffffffffc0);
      }
      generatePortRequestReply(in_stack_00000088,in_stack_00000080);
      std::pair<std::shared_ptr<helics::Broker>,_bool>::~pair
                ((pair<std::shared_ptr<helics::Broker>,_bool> *)0x1fb845);
    }
  }
  else {
    ActionMessage::ActionMessage(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return in_RDI;
}

Assistant:

ActionMessage TypedBrokerServer::generateMessageResponse(const ActionMessage& rxcmd,
                                                         portData& pdata,
                                                         CoreType ctype)
{
    //   std::cout << "received data length " << msg.size () << std::endl;
    switch (rxcmd.action()) {
        case CMD_PROTOCOL:
        case CMD_PROTOCOL_PRIORITY:
        case CMD_PROTOCOL_BIG:
            switch (rxcmd.messageID) {
                case REQUEST_PORTS:
                case CONNECTION_INFORMATION: {
                    auto pt = getOpenPort(pdata);
                    if (pt > 0) {
                        auto nbrk = findBroker(rxcmd, ctype, pt);
                        if (nbrk.second) {
                            assignPort(pdata, pt, nbrk.first);
                        }
                        return generatePortRequestReply(rxcmd, nbrk.first);
                    }
                    ActionMessage rep(CMD_PROTOCOL);
                    rep.messageID = DELAY_CONNECTION;
                    return rep;
                } break;
            }
            break;
        default:
            // std::cout << "received unknown message " << msg.size() << std::endl;
            // repSocket.send("ignored");
            break;
    }
    return CMD_IGNORE;
}